

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  __m256i alVar7;
  __m256i alVar8;
  uint uVar9;
  int iVar10;
  parasail_result_t *ppVar11;
  __m256i *ptr;
  __m256i *palVar12;
  __m256i *ptr_00;
  int64_t *ptr_01;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  __m256i *palVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  __m256i *palVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  ulong size;
  undefined8 uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 in_ZMM11 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar31 [32];
  
  auVar45 = in_ZMM12._0_16_;
  auVar43 = in_ZMM11._0_32_;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sg_flags_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_sg_flags_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_striped_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_striped_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_striped_profile_avx2_256_64_cold_1();
        }
        else {
          uVar20 = uVar2 - 1;
          size = (ulong)uVar2 + 3 >> 2;
          uVar5 = (ulong)uVar20 % size;
          iVar10 = (int)(uVar20 / size);
          uVar15 = CONCAT44(0,open);
          iVar26 = -open;
          iVar13 = ppVar4->min;
          uVar16 = 0x8000000000000000 - (long)iVar13;
          if (iVar13 != iVar26 && SBORROW4(iVar13,iVar26) == iVar13 + open < 0) {
            uVar16 = uVar15 | 0x8000000000000000;
          }
          iVar13 = ppVar4->max;
          ppVar11 = parasail_result_new();
          if (ppVar11 != (parasail_result_t *)0x0) {
            ppVar11->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar11->flag | 0x4800802;
            ptr = parasail_memalign___m256i(0x20,size);
            palVar12 = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                (palVar12 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) {
              iVar1 = s2Len + -1;
              iVar21 = -iVar10 + 3;
              auVar37._8_4_ = open;
              auVar37._0_8_ = uVar15;
              auVar37._12_4_ = 0;
              auVar37._16_4_ = open;
              auVar37._20_4_ = 0;
              auVar37._24_4_ = open;
              auVar37._28_4_ = 0;
              auVar38._8_4_ = gap;
              auVar38._0_8_ = CONCAT44(0,gap);
              auVar38._12_4_ = 0;
              auVar38._16_4_ = gap;
              auVar38._20_4_ = 0;
              auVar38._24_4_ = gap;
              auVar38._28_4_ = 0;
              lVar17 = uVar16 + 1;
              lVar23 = 0x7ffffffffffffffe - (long)iVar13;
              auVar30._8_8_ = lVar17;
              auVar30._0_8_ = lVar17;
              auVar31._16_8_ = lVar17;
              auVar31._0_16_ = auVar30;
              auVar31._24_8_ = lVar17;
              auVar32._8_8_ = lVar23;
              auVar32._0_8_ = lVar23;
              auVar32._16_8_ = lVar23;
              auVar32._24_8_ = lVar23;
              bVar29 = s1_beg != 0;
              uVar25 = (ulong)iVar26;
              uVar27 = (uint)size;
              auVar41._4_4_ = uVar27;
              auVar41._0_4_ = uVar27;
              auVar41._8_4_ = uVar27;
              auVar41._12_4_ = uVar27;
              auVar41._16_4_ = uVar27;
              auVar41._20_4_ = uVar27;
              auVar41._24_4_ = uVar27;
              auVar41._28_4_ = uVar27;
              auVar35._8_4_ = gap;
              auVar35._0_8_ = CONCAT44(0,gap);
              auVar35._12_4_ = 0;
              auVar35._16_4_ = gap;
              auVar35._20_4_ = 0;
              auVar35._24_4_ = gap;
              auVar35._28_4_ = 0;
              auVar40._8_8_ = uVar25;
              auVar40._0_8_ = uVar25;
              auVar40._16_8_ = uVar25;
              auVar40._24_8_ = uVar25;
              auVar48 = vpmuldq_avx2(auVar41,_DAT_00908b60);
              auVar44[1] = bVar29;
              auVar44[0] = bVar29;
              auVar44[2] = bVar29;
              auVar44[3] = bVar29;
              auVar44[4] = bVar29;
              auVar44[5] = bVar29;
              auVar44[6] = bVar29;
              auVar44[7] = bVar29;
              auVar44[8] = bVar29;
              auVar44[9] = bVar29;
              auVar44[10] = bVar29;
              auVar44[0xb] = bVar29;
              auVar44[0xc] = bVar29;
              auVar44[0xd] = bVar29;
              auVar44[0xe] = bVar29;
              auVar44[0xf] = bVar29;
              uVar16 = 0;
              auVar44 = vpslld_avx(auVar44,0x1f);
              auVar44 = vpsrad_avx(auVar44,0x1f);
              auVar41 = vpmovsxdq_avx2(auVar44);
              palVar18 = ptr;
              palVar22 = ptr_00;
              do {
                auVar47._8_8_ = uVar16;
                auVar47._0_8_ = uVar16;
                auVar47._16_8_ = uVar16;
                auVar47._24_8_ = uVar16;
                auVar47 = vpaddq_avx2(auVar47,auVar48);
                auVar50 = vpmuludq_avx2(auVar47,auVar35);
                auVar47 = vpsrlq_avx2(auVar47,0x20);
                auVar47 = vpmuludq_avx2(auVar47,auVar35);
                auVar47 = vpsllq_avx2(auVar47,0x20);
                auVar47 = vpaddq_avx2(auVar50,auVar47);
                auVar47 = vpsubq_avx2(auVar40,auVar47);
                alVar7 = (__m256i)vpandn_avx2(auVar41,auVar47);
                alVar8 = (__m256i)vpsubq_avx2((undefined1  [32])alVar7,auVar37);
                *palVar18 = alVar7;
                *palVar22 = alVar8;
                uVar16 = uVar16 + 1;
                palVar22 = palVar22 + 1;
                palVar18 = palVar18 + 1;
              } while (size != uVar16);
              *ptr_01 = 0;
              lVar23 = (ulong)(uint)s2Len - 1;
              auVar50._8_8_ = lVar23;
              auVar50._0_8_ = lVar23;
              auVar50._16_8_ = lVar23;
              auVar50._24_8_ = lVar23;
              auVar34._4_4_ = gap;
              auVar34._0_4_ = gap;
              auVar34._8_4_ = gap;
              auVar34._12_4_ = gap;
              auVar39._4_4_ = iVar26;
              auVar39._0_4_ = iVar26;
              auVar39._8_4_ = iVar26;
              auVar39._12_4_ = iVar26;
              auVar44 = vpmovsxbd_avx(ZEXT416(0x4030201));
              uVar16 = 0;
              auVar41 = vpmovsxbq_avx2(ZEXT416(0x3020100));
              auVar48._8_8_ = 0x8000000000000000;
              auVar48._0_8_ = 0x8000000000000000;
              auVar48._16_8_ = 0x8000000000000000;
              auVar48._24_8_ = 0x8000000000000000;
              auVar43 = vpcmpeqd_avx2(auVar43,auVar43);
              auVar45 = vpcmpeqd_avx(auVar45,auVar45);
              auVar51._8_4_ = 4;
              auVar51._0_8_ = 0x400000004;
              auVar51._12_4_ = 4;
              do {
                if (s2_beg == 0) {
                  auVar6 = vpaddd_avx(auVar45,auVar44);
                  auVar6 = vpmulld_avx(auVar6,auVar34);
                  auVar6 = vpsubd_avx(auVar39,auVar6);
                  auVar35 = vpmovsxdq_avx2(auVar6);
                }
                else {
                  auVar35 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                }
                auVar52._8_8_ = uVar16;
                auVar52._0_8_ = uVar16;
                auVar52._16_8_ = uVar16;
                auVar52._24_8_ = uVar16;
                auVar40 = vpor_avx2(auVar52,auVar41);
                auVar40 = vpcmpgtq_avx2(auVar40 ^ auVar48,auVar50 ^ auVar48);
                auVar35 = vpmaskmovq_avx2(auVar40 ^ auVar43,auVar35);
                *(undefined1 (*) [32])(ptr_01 + uVar16 + 1) = auVar35;
                uVar16 = uVar16 + 4;
                auVar44 = vpaddd_avx(auVar51,auVar44);
              } while ((s2Len + 3U & 0xfffffffc) != uVar16);
              uVar16 = 0;
              auVar43._0_8_ = -(ulong)(iVar21 == 3);
              auVar43._8_8_ = -(ulong)(iVar21 == 2);
              auVar43._16_8_ = -(ulong)(iVar21 == 1);
              auVar43._24_8_ = -(ulong)(-iVar10 == -3);
              auVar42 = ZEXT3264(auVar31);
              auVar33 = ZEXT3264(auVar31);
              auVar36 = ZEXT3264(auVar32);
              iVar13 = iVar1;
              do {
                palVar18 = ptr;
                ptr = palVar12;
                auVar45 = SUB3216(palVar18[uVar27 - 1],0);
                auVar49._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar30;
                auVar49._16_16_ = ZEXT116(0) * auVar31._16_16_ + ZEXT116(1) * auVar45;
                auVar41 = vpalignr_avx2((undefined1  [32])palVar18[uVar27 - 1],auVar49,8);
                iVar26 = ppVar4->mapper[(byte)s2[uVar16]];
                auVar41 = vpblendd_avx2(auVar41,ZEXT832((ulong)ptr_01[uVar16]),3);
                lVar23 = 0;
                auVar46 = ZEXT3264(auVar31);
                do {
                  auVar48 = vpaddq_avx2(auVar41,*(undefined1 (*) [32])
                                                 ((long)pvVar3 + lVar23 + (long)iVar26 * size * 0x20
                                                 ));
                  auVar41 = *(undefined1 (*) [32])((long)*ptr_00 + lVar23);
                  auVar35 = vpcmpgtq_avx2(auVar48,auVar41);
                  auVar48 = vblendvpd_avx(auVar41,auVar48,auVar35);
                  auVar47 = auVar46._0_32_;
                  auVar35 = vpcmpgtq_avx2(auVar48,auVar47);
                  auVar48 = vblendvpd_avx(auVar47,auVar48,auVar35);
                  *(undefined1 (*) [32])((long)*ptr + lVar23) = auVar48;
                  auVar35 = vpcmpgtq_avx2(auVar33._0_32_,auVar48);
                  auVar35 = vblendvpd_avx(auVar48,auVar33._0_32_,auVar35);
                  auVar33 = ZEXT3264(auVar35);
                  auVar35 = vpcmpgtq_avx2(auVar48,auVar36._0_32_);
                  auVar35 = vblendvpd_avx(auVar48,auVar36._0_32_,auVar35);
                  auVar40 = vpcmpgtq_avx2(auVar41,auVar35);
                  auVar35 = vblendvpd_avx(auVar41,auVar35,auVar40);
                  auVar40 = vpcmpgtq_avx2(auVar47,auVar35);
                  auVar35 = vblendvpd_avx(auVar47,auVar35,auVar40);
                  auVar36 = ZEXT3264(auVar35);
                  auVar48 = vpsubq_avx2(auVar48,auVar37);
                  auVar35 = vpsubq_avx2(auVar41,auVar38);
                  auVar41 = vpcmpgtq_avx2(auVar35,auVar48);
                  auVar41 = vblendvpd_avx(auVar48,auVar35,auVar41);
                  *(undefined1 (*) [32])((long)*ptr_00 + lVar23) = auVar41;
                  auVar35 = vpsubq_avx2(auVar47,auVar38);
                  auVar41 = vpcmpgtq_avx2(auVar35,auVar48);
                  auVar41 = vblendvpd_avx(auVar48,auVar35,auVar41);
                  auVar46 = ZEXT3264(auVar41);
                  auVar41 = *(undefined1 (*) [32])((long)*palVar18 + lVar23);
                  lVar23 = lVar23 + 0x20;
                } while (size << 5 != lVar23);
                iVar26 = 0;
                do {
                  uVar19 = uVar25;
                  if (s2_beg == 0) {
                    uVar19 = ptr_01[uVar16 + 1] - uVar15;
                  }
                  auVar41 = vpermpd_avx2(auVar46._0_32_,0x90);
                  auVar41 = vblendpd_avx(auVar41,ZEXT832(uVar19),1);
                  auVar46 = ZEXT3264(auVar41);
                  lVar23 = 0;
                  do {
                    auVar41 = *(undefined1 (*) [32])((long)*ptr + lVar23);
                    auVar40 = auVar46._0_32_;
                    auVar48 = vpcmpgtq_avx2(auVar41,auVar40);
                    auVar41 = vblendvpd_avx(auVar40,auVar41,auVar48);
                    *(undefined1 (*) [32])((long)*ptr + lVar23) = auVar41;
                    auVar48 = vpcmpgtq_avx2(auVar41,auVar36._0_32_);
                    auVar48 = vblendvpd_avx(auVar41,auVar36._0_32_,auVar48);
                    auVar36 = ZEXT3264(auVar48);
                    auVar35 = vpcmpgtq_avx2(auVar33._0_32_,auVar41);
                    auVar35 = vblendvpd_avx(auVar41,auVar33._0_32_,auVar35);
                    auVar33 = ZEXT3264(auVar35);
                    auVar41 = vpsubq_avx2(auVar41,auVar37);
                    auVar40 = vpsubq_avx2(auVar40,auVar38);
                    auVar46 = ZEXT3264(auVar40);
                    auVar41 = vpcmpgtq_avx2(auVar40,auVar41);
                    if ((((auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar41 >> 0x7f,0) == '\0') && SUB321(auVar41 >> 0xbf,0) == '\0') &&
                        -1 < auVar41[0x1f]) goto LAB_0077315f;
                    lVar23 = lVar23 + 0x20;
                  } while (size << 5 != lVar23);
                  iVar26 = iVar26 + 1;
                } while (iVar26 != 4);
LAB_0077315f:
                auVar40 = vpcmpgtq_avx2((undefined1  [32])ptr[uVar5],auVar42._0_32_);
                auVar41 = vblendvpd_avx(auVar42._0_32_,(undefined1  [32])ptr[uVar5],auVar40);
                auVar45 = auVar41._16_16_;
                auVar42 = ZEXT3264(auVar41);
                auVar40 = auVar43 & auVar40;
                if ((((auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar40 >> 0x7f,0) != '\0') || SUB321(auVar40 >> 0xbf,0) != '\0') ||
                    auVar40[0x1f] < '\0') {
                  iVar13 = (int)uVar16;
                }
                uVar16 = uVar16 + 1;
                palVar12 = palVar18;
                if (uVar16 == (uint)s2Len) {
                  if (s2_end != 0) {
                    if (iVar10 < 3) {
                      iVar26 = 0;
                      do {
                        auVar41 = auVar42._0_32_;
                        auVar43 = vperm2i128_avx2(auVar41,auVar41,8);
                        auVar43 = vpalignr_avx2(auVar41,auVar43,8);
                        auVar45 = auVar43._16_16_;
                        auVar42 = ZEXT3264(auVar43);
                        iVar26 = iVar26 + 1;
                      } while (iVar26 < iVar21);
                    }
                    lVar17 = vpextrq_avx(auVar45,1);
                  }
                  uVar14 = uVar20;
                  if ((s1_end != 0) && (((ulong)uVar2 + 3 & 0x7ffffffc) != 0)) {
                    uVar16 = 0;
                    lVar23 = lVar17;
                    do {
                      uVar24 = ((uint)uVar16 & 3) * uVar27 + ((uint)(uVar16 >> 2) & 0x3fffffff);
                      lVar17 = lVar23;
                      iVar26 = iVar13;
                      uVar9 = uVar14;
                      if (((int)uVar24 < (int)uVar2) &&
                         (lVar17 = (*ptr)[uVar16], iVar26 = iVar1, uVar9 = uVar24, lVar17 <= lVar23)
                         ) {
                        if ((int)uVar14 <= (int)uVar24) {
                          uVar24 = uVar14;
                        }
                        if (iVar13 != iVar1) {
                          uVar24 = uVar14;
                        }
                        bVar29 = lVar17 == lVar23;
                        lVar17 = lVar23;
                        iVar26 = iVar13;
                        uVar9 = uVar14;
                        if (bVar29) {
                          uVar9 = uVar24;
                        }
                      }
                      uVar14 = uVar9;
                      iVar13 = iVar26;
                      uVar16 = uVar16 + 1;
                      lVar23 = lVar17;
                    } while ((uVar27 & 0x1fffffff) << 2 != (int)uVar16);
                  }
                  iVar26 = (int)lVar17;
                  if (s2_end == 0 && s1_end == 0) {
                    alVar7 = ptr[uVar5];
                    auVar45 = alVar7._16_16_;
                    if (iVar10 < 3) {
                      iVar13 = 0;
                      do {
                        auVar43 = vperm2i128_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar7,
                                                  8);
                        alVar7 = (__m256i)vpalignr_avx2((undefined1  [32])alVar7,auVar43,8);
                        auVar45 = alVar7._16_16_;
                        iVar13 = iVar13 + 1;
                      } while (iVar13 < iVar21);
                    }
                    uVar28 = vpextrq_avx(auVar45,1);
                    iVar26 = (int)uVar28;
                    iVar13 = iVar1;
                    uVar14 = uVar20;
                  }
                  auVar43 = vpcmpgtq_avx2(auVar31,auVar48);
                  auVar41 = vpcmpgtq_avx2(auVar35,auVar32);
                  auVar43 = vpor_avx2(auVar41,auVar43);
                  if ((((auVar43 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar43 >> 0x7f,0) != '\0') || SUB321(auVar43 >> 0xbf,0) != '\0') ||
                      auVar43[0x1f] < '\0') {
                    *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
                    iVar26 = 0;
                    iVar13 = 0;
                    uVar14 = 0;
                  }
                  ppVar11->score = iVar26;
                  ppVar11->end_query = uVar14;
                  ppVar11->end_ref = iVar13;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(palVar18);
                  parasail_free(ptr);
                  return ppVar11;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}